

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tracks::AddTrack(Tracks *this,Track *track,int32_t number)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  void *pvVar6;
  uint in_EDX;
  Track *in_RSI;
  long *in_RDI;
  uint32_t i_2;
  bool exit;
  uint32_t i_1;
  Track **track_entries;
  uint32_t count;
  uint32_t i;
  uint32_t track_num;
  uint local_3c;
  uint local_34;
  uint local_24;
  uint local_20;
  bool local_1;
  
  if (((int)in_EDX < 0) || ((*(byte *)((long)in_RDI + 0xc) & 1) != 0)) {
    local_1 = false;
  }
  else if ((int)in_EDX < 0x7f) {
    if (in_EDX != 0) {
      for (local_24 = 0; local_24 < *(uint *)(in_RDI + 1); local_24 = local_24 + 1) {
        uVar4 = Track::number(*(Track **)(*in_RDI + (ulong)local_24 * 8));
        if (uVar4 == in_EDX) {
          return false;
        }
      }
    }
    uVar3 = (int)in_RDI[1] + 1;
    uVar5 = SUB168(ZEXT416(uVar3) * ZEXT816(8),0);
    if (SUB168(ZEXT416(uVar3) * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pvVar6 = operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    if (pvVar6 == (void *)0x0) {
      local_1 = false;
    }
    else {
      for (local_34 = 0; local_34 < *(uint *)(in_RDI + 1); local_34 = local_34 + 1) {
        *(undefined8 *)((long)pvVar6 + (ulong)local_34 * 8) =
             *(undefined8 *)(*in_RDI + (ulong)local_34 * 8);
      }
      if ((void *)*in_RDI != (void *)0x0) {
        operator_delete__((void *)*in_RDI);
      }
      local_20 = uVar3;
      uVar2 = in_EDX;
      if (in_EDX == 0) {
        do {
          bVar1 = true;
          for (local_3c = 0; local_3c < *(uint *)(in_RDI + 1); local_3c = local_3c + 1) {
            uVar4 = Track::number(*(Track **)((long)pvVar6 + (ulong)local_3c * 8));
            if (uVar4 == local_20) {
              local_20 = local_20 + 1;
              bVar1 = false;
              break;
            }
          }
          uVar2 = local_20;
        } while (!bVar1);
      }
      local_20 = uVar2;
      Track::set_number(in_RSI,(ulong)local_20);
      *in_RDI = (long)pvVar6;
      *(Track **)(*in_RDI + (ulong)*(uint *)(in_RDI + 1) * 8) = in_RSI;
      *(uint *)(in_RDI + 1) = uVar3;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tracks::AddTrack(Track* track, int32_t number) {
  if (number < 0 || wrote_tracks_)
    return false;

  // This muxer only supports track numbers in the range [1, 126], in
  // order to be able (to use Matroska integer representation) to
  // serialize the block header (of which the track number is a part)
  // for a frame using exactly 4 bytes.

  if (number > 0x7E)
    return false;

  uint32_t track_num = number;

  if (track_num > 0) {
    // Check to make sure a track does not already have |track_num|.
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      if (track_entries_[i]->number() == track_num)
        return false;
    }
  }

  const uint32_t count = track_entries_size_ + 1;

  Track** const track_entries = new (std::nothrow) Track*[count];  // NOLINT
  if (!track_entries)
    return false;

  for (uint32_t i = 0; i < track_entries_size_; ++i) {
    track_entries[i] = track_entries_[i];
  }

  delete[] track_entries_;

  // Find the lowest availible track number > 0.
  if (track_num == 0) {
    track_num = count;

    // Check to make sure a track does not already have |track_num|.
    bool exit = false;
    do {
      exit = true;
      for (uint32_t i = 0; i < track_entries_size_; ++i) {
        if (track_entries[i]->number() == track_num) {
          track_num++;
          exit = false;
          break;
        }
      }
    } while (!exit);
  }
  track->set_number(track_num);

  track_entries_ = track_entries;
  track_entries_[track_entries_size_] = track;
  track_entries_size_ = count;
  return true;
}